

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char> __thiscall
fmt::v11::detail::digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>
          (digit_grouping<char> *this,basic_appender<char> out,basic_string_view<char> digits)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  char *begin;
  size_t sVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  int iVar8;
  byte *pbVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_> separators;
  undefined4 *local_828;
  long lStack_820;
  ulong local_818;
  code *local_810;
  undefined4 local_808 [502];
  
  uVar7 = digits.size_;
  local_828 = local_808;
  local_810 = basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_>::grow;
  local_818 = 500;
  local_808[0] = 0;
  pbVar9 = (byte *)(this->grouping_)._M_dataplus._M_p;
  iVar8 = 0;
  lStack_820 = 1;
  do {
    iVar11 = 0x7fffffff;
    if ((this->thousands_sep_)._M_string_length != 0) {
      pbVar6 = (byte *)((this->grouping_)._M_dataplus._M_p + (this->grouping_)._M_string_length);
      if (pbVar9 == pbVar6) {
        uVar5 = (uint)(char)pbVar6[-1];
      }
      else {
        bVar2 = *pbVar9;
        if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_0015ea7f;
        pbVar9 = pbVar9 + 1;
        uVar5 = (uint)bVar2;
      }
      iVar11 = iVar8 + uVar5;
      iVar8 = iVar11;
    }
LAB_0015ea7f:
    uVar5 = (uint)digits.size_;
    if (iVar11 >= (int)uVar5 || iVar11 == 0) break;
    if (local_818 < lStack_820 + 1U) {
      (*local_810)(&local_828);
    }
    lVar1 = lStack_820 + 1;
    local_828[lStack_820] = iVar11;
    lStack_820 = lVar1;
  } while (iVar11 < (int)uVar5 && iVar11 != 0);
  if (0 < (int)uVar5) {
    iVar8 = (int)lStack_820 + -1;
    uVar12 = 0;
    do {
      if ((int)uVar7 == local_828[iVar8]) {
        begin = (this->thousands_sep_)._M_dataplus._M_p;
        buffer<char>::append<char>
                  (out.container,begin,begin + (this->thousands_sep_)._M_string_length);
        iVar8 = iVar8 + -1;
      }
      cVar3 = digits.data_[uVar12];
      uVar10 = (out.container)->size_ + 1;
      if ((out.container)->capacity_ < uVar10) {
        (*(out.container)->grow_)(out.container,uVar10);
      }
      sVar4 = (out.container)->size_;
      (out.container)->size_ = sVar4 + 1;
      (out.container)->ptr_[sVar4] = cVar3;
      uVar12 = uVar12 + 1;
      uVar7 = (ulong)((int)uVar7 - 1);
    } while ((uVar5 & 0x7fffffff) != uVar12);
  }
  if (local_828 != local_808) {
    free(local_828);
  }
  return (basic_appender<char>)out.container;
}

Assistant:

auto apply(Out out, basic_string_view<C> digits) const -> Out {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        out = copy<Char>(thousands_sep_.data(),
                         thousands_sep_.data() + thousands_sep_.size(), out);
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }